

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.c
# Opt level: O1

void golf_gi_add_lightmap_section
               (golf_gi_t *gi,golf_lightmap_section_t *lightmap_section,golf_model_t *model,
               golf_transform_t transform,golf_movement_t movement,_Bool should_draw)

{
  vec_golf_gi_lightmap_section_t *data;
  int *length;
  vec3 *pvVar1;
  golf_gi_lightmap_section_t *pgVar2;
  vec2 vVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  vec3 local_d8 [3];
  float fStack_b4;
  golf_movement_t local_b0;
  char *local_88;
  int aiStack_80 [2];
  char *local_78;
  char *local_70;
  int aiStack_68 [2];
  char *local_60;
  char *local_58;
  int aiStack_50 [2];
  char *local_48;
  undefined1 local_40;
  golf_lightmap_section_t *local_38;
  
  if (gi->has_cur_entity == true) {
    local_88 = (char *)0x0;
    aiStack_80[0] = 0;
    aiStack_80[1] = 0;
    local_78 = "gi";
    local_70 = (char *)0x0;
    aiStack_68[0] = 0;
    aiStack_68[1] = 0;
    local_60 = "gi";
    local_58 = (char *)0x0;
    aiStack_50[0] = 0;
    aiStack_50[1] = 0;
    local_48 = "gi";
    iVar8 = (model->positions).length;
    iVar5 = vec_reserve_po2_(&local_88,aiStack_80,aiStack_80 + 1,0xc,iVar8,"gi");
    if (iVar5 == 0 && 0 < (long)iVar8) {
      lVar6 = 0;
      do {
        lVar7 = (long)aiStack_80[0];
        aiStack_80[0] = aiStack_80[0] + 1;
        pvVar1 = (model->positions).data;
        *(undefined8 *)(local_88 + lVar7 * 0xc) = *(undefined8 *)((long)&pvVar1->x + lVar6);
        *(undefined4 *)(local_88 + lVar7 * 0xc + 8) = *(undefined4 *)((long)&pvVar1->z + lVar6);
        lVar6 = lVar6 + 0xc;
      } while ((long)iVar8 * 0xc != lVar6);
    }
    iVar8 = (model->normals).length;
    iVar5 = vec_reserve_po2_(&local_70,aiStack_68,aiStack_68 + 1,0xc,aiStack_68[0] + iVar8,local_60)
    ;
    if (iVar5 == 0 && 0 < (long)iVar8) {
      lVar6 = 0;
      do {
        lVar7 = (long)aiStack_68[0];
        aiStack_68[0] = aiStack_68[0] + 1;
        pvVar1 = (model->normals).data;
        *(undefined8 *)(local_70 + lVar7 * 0xc) = *(undefined8 *)((long)&pvVar1->x + lVar6);
        *(undefined4 *)(local_70 + lVar7 * 0xc + 8) = *(undefined4 *)((long)&pvVar1->z + lVar6);
        lVar6 = lVar6 + 0xc;
      } while ((long)iVar8 * 0xc != lVar6);
    }
    if (0 < (model->positions).length) {
      iVar8 = 0;
      do {
        iVar5 = vec_expand_(&local_58,aiStack_50,aiStack_50 + 1,8,local_48);
        pcVar4 = local_58;
        if (iVar5 == 0) {
          lVar6 = (long)aiStack_50[0];
          aiStack_50[0] = aiStack_50[0] + 1;
          vVar3 = vec2_create(0.0,0.0);
          *(vec2 *)(pcVar4 + lVar6 * 8) = vVar3;
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < (model->positions).length);
    }
    local_d8[2].z = transform.scale.y;
    fStack_b4 = transform.scale.z;
    local_d8[1].y = transform.rotation.y;
    local_d8[1].z = transform.rotation.z;
    local_d8[2].x = transform.rotation.w;
    local_d8[2].y = transform.scale.x;
    local_d8[0].x = transform.position.x;
    local_d8[0].y = transform.position.y;
    local_d8[0].z = transform.position.z;
    local_d8[1].x = transform.rotation.x;
    local_b0.type = movement.type;
    local_b0.repeats = movement.repeats;
    local_b0._5_3_ = movement._5_3_;
    local_b0.t0 = movement.t0;
    local_b0.length = movement.length;
    local_b0.field_4._0_8_ = movement.field_4._0_8_;
    local_b0.field_4._8_8_ = movement.field_4._8_8_;
    local_b0.field_4._16_8_ = movement.field_4._16_8_;
    data = &(gi->cur_entity).gi_lightmap_sections;
    length = &(gi->cur_entity).gi_lightmap_sections.length;
    local_40 = should_draw;
    local_38 = lightmap_section;
    iVar8 = vec_expand_((char **)data,length,&(gi->cur_entity).gi_lightmap_sections.capacity,0xa8,
                        (gi->cur_entity).gi_lightmap_sections.alloc_category);
    if (iVar8 == 0) {
      iVar8 = *length;
      pgVar2 = data->data;
      *length = iVar8 + 1;
      memcpy(pgVar2 + iVar8,local_d8,0xa8);
    }
  }
  return;
}

Assistant:

void golf_gi_add_lightmap_section(golf_gi_t *gi, golf_lightmap_section_t *lightmap_section, golf_model_t *model, golf_transform_t transform, golf_movement_t movement, bool should_draw) {
    if (!gi->has_cur_entity) {
        return;
    }

    golf_gi_lightmap_section_t section;
    vec_init(&section.positions, "gi");
    vec_init(&section.normals, "gi");
    vec_init(&section.lightmap_uvs, "gi");
    vec_pusharr(&section.positions, model->positions.data, model->positions.length);
    vec_pusharr(&section.normals, model->normals.data, model->normals.length);
    for (int i = 0; i < model->positions.length; i++) {
        vec_push(&section.lightmap_uvs, V2(0, 0));
    }
    section.transform = transform;
    section.movement = movement;
    section.lightmap_section = lightmap_section;
    section.should_draw = should_draw;
    vec_push(&gi->cur_entity.gi_lightmap_sections, section);
}